

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeCommandListAppendImageCopyFromMemoryExt
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,void *srcptr,
          ze_image_region_t *pDstRegion,uint32_t srcRowPitch,uint32_t srcSlicePitch,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ze_result_t zVar4;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 local_48;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x2e8);
  if (pcVar1 == (code *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(undefined8 *)hSignalEvent;
    }
    uVar2 = *(undefined8 *)hCommandList;
    uVar3 = *(undefined8 *)hDstImage;
    pvVar5 = operator_new__((ulong)numWaitEvents * 8);
    if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
      uVar6 = 1;
      do {
        *(undefined8 *)((long)pvVar5 + uVar6 * 8 + -8) = *(undefined8 *)phWaitEvents[uVar6 - 1];
        if (phWaitEvents == (ze_event_handle_t *)0x0) break;
        bVar7 = uVar6 < numWaitEvents;
        uVar6 = uVar6 + 1;
      } while (bVar7);
    }
    zVar4 = (*pcVar1)(uVar2,uVar3,srcptr,pDstRegion,srcRowPitch,srcSlicePitch,local_48,numWaitEvents
                      ,pvVar5);
    operator_delete__(pvVar5);
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyFromMemoryExt(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        const ze_image_region_t* pDstRegion,            ///< [in][optional] destination region descriptor
        uint32_t srcRowPitch,                           ///< [in] size in bytes of the 1D slice of the 2D region of a 2D or 3D
                                                        ///< image or each image of a 1D or 2D image array being read
        uint32_t srcSlicePitch,                         ///< [in] size in bytes of the 2D slice of the 3D region of a 3D image or
                                                        ///< each image of a 1D or 2D image array being read
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendImageCopyFromMemoryExt = dditable->ze.CommandList.pfnAppendImageCopyFromMemoryExt;
        if( nullptr == pfnAppendImageCopyFromMemoryExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hDstImage = reinterpret_cast<ze_image_object_t*>( hDstImage )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendImageCopyFromMemoryExt( hCommandList, hDstImage, srcptr, pDstRegion, srcRowPitch, srcSlicePitch, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phWaitEventsLocal;

        return result;
    }